

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,double value)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  char buffer [32];
  undefined8 local_38;
  undefined1 local_30;
  
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    uVar1 = snprintf((char *)&local_38,0x20,"%.16g");
  }
  else if (NAN(value)) {
    uVar3 = (ulong)local_38 >> 0x20;
    local_38 = CONCAT44((uint)uVar3 & 0xffffff00,0x6c6c756e);
    uVar1 = 4;
  }
  else if (0.0 <= value) {
    local_38 = 0x393939392b6531;
    uVar1 = 7;
  }
  else {
    local_38 = 0x393939392b65312d;
    local_30 = 0;
    uVar1 = 8;
  }
  if (-1 < (int)uVar1) {
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        if (*(char *)((long)&local_38 + uVar3) == ',') {
          *(undefined1 *)((long)&local_38 + uVar3) = 0x2e;
        }
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen((char *)&local_38);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,&local_38,(long)&local_38 + sVar2);
    return __return_storage_ptr__;
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                ,0x8a,"std::string Json::valueToString(double)");
}

Assistant:

std::string valueToString(double value) {
  // Allocate a buffer that is more than large enough to store the 16 digits of
  // precision requested below.
  char buffer[32];
  int len = -1;

// Print into the buffer. We need not request the alternative representation
// that always has a decimal point because JSON doesn't distingish the
// concepts of reals and integers.
#if defined(_MSC_VER) && defined(__STDC_SECURE_LIB__) // Use secure version with
                                                      // visual studio 2005 to
                                                      // avoid warning.
#if defined(WINCE)
  len = _snprintf(buffer, sizeof(buffer), "%.16g", value);
#else
  len = sprintf_s(buffer, sizeof(buffer), "%.16g", value);
#endif
#else
  if (isfinite(value)) {
    len = snprintf(buffer, sizeof(buffer), "%.16g", value);
  } else {
    // IEEE standard states that NaN values will not compare to themselves
    if (value != value) {
      len = snprintf(buffer, sizeof(buffer), "null");
    } else if (value < 0) {
      len = snprintf(buffer, sizeof(buffer), "-1e+9999");
    } else {
      len = snprintf(buffer, sizeof(buffer), "1e+9999");
    }
    // For those, we do not need to call fixNumLoc, but it is fast.
  }
#endif
  assert(len >= 0);
  fixNumericLocale(buffer, buffer + len);
  return buffer;
}